

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

void ts_lexer_goto(Lexer *self,Length position)

{
  ulong uVar1;
  ulong uVar2;
  TSRange *pTVar3;
  uint32_t uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  uint i;
  ulong uVar8;
  bool bVar9;
  
  uVar4 = position.extent.column;
  uVar6 = position._0_8_;
  uVar2 = uVar6 >> 0x20;
  pTVar3 = self->included_ranges;
  uVar7 = self->included_range_count;
  uVar1 = 0;
  do {
    uVar8 = uVar1;
    if (uVar7 <= uVar8) {
      uVar5 = pTVar3[uVar7 - 1].end_byte;
      uVar2 = (ulong)pTVar3[uVar7 - 1].end_point.row;
      uVar4 = pTVar3[uVar7 - 1].end_point.column;
      self->chunk = "";
      self->chunk_start = uVar5;
      self->chunk_size = 2;
      bVar9 = false;
      goto LAB_00112039;
    }
    uVar1 = (ulong)((int)uVar8 + 1);
  } while (pTVar3[uVar8].end_byte <= position.bytes);
  pTVar3 = pTVar3 + uVar8;
  if (position.bytes < pTVar3->start_byte) {
    uVar2 = (ulong)(pTVar3->start_point).row;
    uVar4 = (pTVar3->start_point).column;
    uVar6 = (ulong)pTVar3->start_byte;
  }
  uVar5 = (uint)uVar6;
  self->current_included_range_index = uVar8;
  bVar9 = self->chunk == (char *)0x0;
LAB_00112039:
  uVar7 = (ulong)uVar5 | uVar2 << 0x20;
  (self->token_start_position).bytes = (int)uVar7;
  (self->token_start_position).extent.row = (int)(uVar7 >> 0x20);
  (self->token_start_position).extent.column = uVar4;
  (self->token_end_position).bytes = 0;
  (self->token_end_position).extent.row = 0;
  (self->token_end_position).extent.column = 1;
  (self->current_position).bytes = (int)uVar7;
  (self->current_position).extent.row = (int)(uVar7 >> 0x20);
  (self->current_position).extent.column = uVar4;
  if ((!bVar9) && ((uVar5 < self->chunk_start || (self->chunk_start + self->chunk_size <= uVar5))))
  {
    self->chunk = (char *)0x0;
    self->chunk_start = 0;
    self->chunk_size = 0;
  }
  self->lookahead_size = 0;
  (self->data).lookahead = 0;
  return;
}

Assistant:

static void ts_lexer_goto(Lexer *self, Length position) {
  bool found_included_range = false;
  for (unsigned i = 0; i < self->included_range_count; i++) {
    TSRange *included_range = &self->included_ranges[i];
    if (included_range->end_byte > position.bytes) {
      if (included_range->start_byte > position.bytes) {
        position = (Length) {
          .bytes = included_range->start_byte,
          .extent = included_range->start_point,
        };
      }

      self->current_included_range_index = i;
      found_included_range = true;
      break;
    }
  }

  if (!found_included_range) {
    TSRange *last_included_range = &self->included_ranges[self->included_range_count - 1];
    position = (Length) {
      .bytes = last_included_range->end_byte,
      .extent = last_included_range->end_point,
    };
    self->chunk = empty_chunk;
    self->chunk_start = position.bytes;
    self->chunk_size = 2;
  }

  self->token_start_position = position;
  self->token_end_position = LENGTH_UNDEFINED;
  self->current_position = position;

  if (self->chunk && (position.bytes < self->chunk_start ||
                      position.bytes >= self->chunk_start + self->chunk_size)) {
    self->chunk = 0;
    self->chunk_start = 0;
    self->chunk_size = 0;
  }

  self->lookahead_size = 0;
  self->data.lookahead = 0;
}